

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::SetupInitial(ChElementShellBST *this,ChSystem *system)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pointer psVar19;
  element_type *peVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  ChVector<double> *this_00;
  ChElementShellBST *pCVar46;
  ChElementShellBST *pCVar47;
  ChLog *this_01;
  double *pdVar48;
  ChVector<double> *pCVar49;
  ulong uVar50;
  long lVar51;
  uint index;
  long lVar52;
  ulong uVar53;
  long lVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  ChMatrixNM<double,_2,_2> Jxu;
  bool invertible;
  ChVector<double> v;
  ChVector<double> t0_3;
  ChVector<double> result_3;
  ChVector<double> n_i;
  ChVector<double> t0i_3;
  ChVector<double> result;
  ChVector<double> local_260;
  undefined8 local_248;
  ChVector<double> *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  ChVector<double> *local_218;
  ChElementShellBST *local_210;
  undefined8 uStack_208;
  ChVector<double> *local_200;
  bool local_1f1;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  ChVector<double> local_1c0;
  double local_1a0;
  undefined8 uStack_198;
  ChVector<double> local_190;
  double local_178;
  double local_170;
  ulong uStack_168;
  ChVector<double> local_160;
  ChVector<double> local_140;
  double local_128;
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  double dStack_100;
  undefined8 local_f8;
  double local_f0;
  ulong local_e8;
  ChVector<double> *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  ChVector<double> local_c0;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_90 [16];
  double local_80;
  undefined8 local_70;
  double local_68;
  ulong local_60;
  
  SetAsNeutral(this);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
  local_210 = (ChElementShellBST *)(local_260.m_data[0] - local_1c0.m_data[0]);
  uStack_208 = 0;
  auVar24._8_8_ = local_260.m_data[2];
  auVar24._0_8_ = local_260.m_data[1];
  auVar36._8_8_ = local_1c0.m_data[2];
  auVar36._0_8_ = local_1c0.m_data[1];
  local_1e0 = vsubpd_avx(auVar24,auVar36);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(local_110);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_190.m_data[2];
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dStack_100;
  auVar32._8_8_ = uStack_208;
  auVar32._0_8_ = local_210;
  auVar21 = vmovhpd_avx(auVar77,local_190.m_data[0]);
  auVar22 = vmovhpd_avx(auVar97,local_110._0_8_);
  auVar22 = vsubpd_avx(auVar21,auVar22);
  auVar21 = vshufpd_avx(local_1e0,auVar32,1);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_190.m_data[1] - (double)local_110._8_8_;
  auVar23 = vunpcklpd_avx(auVar56,auVar22);
  auVar98._0_8_ = auVar23._0_8_ * auVar21._0_8_;
  auVar98._8_8_ = auVar23._8_8_ * auVar21._8_8_;
  local_c0.m_data._0_16_ = vfmsub231pd_fma(auVar98,local_1e0,auVar22);
  auVar21 = vshufpd_avx(auVar22,auVar22,1);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar21._0_8_ * local_1e0._0_8_;
  auVar21 = vfmsub231sd_fma(auVar78,auVar32,auVar56);
  local_c0.m_data[2] = auVar21._0_8_;
  dVar55 = ChVector<double>::Length(&local_c0);
  this->area = dVar55 * 0.5;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
  auVar21._8_8_ = local_260.m_data[1];
  auVar21._0_8_ = local_260.m_data[0];
  auVar33._8_8_ = local_1c0.m_data[1];
  auVar33._0_8_ = local_1c0.m_data[0];
  local_c0.m_data._0_16_ = vsubpd_avx(auVar21,auVar33);
  local_c0.m_data[2] = local_260.m_data[2] - local_1c0.m_data[2];
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
  auVar22._8_8_ = local_260.m_data[1];
  auVar22._0_8_ = local_260.m_data[0];
  auVar34._8_8_ = local_1c0.m_data[1];
  auVar34._0_8_ = local_1c0.m_data[0];
  local_a8 = vsubpd_avx(auVar22,auVar34);
  local_98 = local_260.m_data[2] - local_1c0.m_data[2];
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  local_210 = this;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
  pCVar46 = local_210;
  auVar23._8_8_ = local_260.m_data[1];
  auVar23._0_8_ = local_260.m_data[0];
  auVar35._8_8_ = local_1c0.m_data[1];
  auVar35._0_8_ = local_1c0.m_data[0];
  local_90 = vsubpd_avx(auVar23,auVar35);
  local_80 = local_260.m_data[2] - local_1c0.m_data[2];
  for (lVar52 = 0; pCVar47 = local_210, lVar52 != 0x48; lVar52 = lVar52 + 0x18) {
    pCVar49 = (ChVector<double> *)((long)local_c0.m_data + lVar52);
    ChVector<double>::GetNormalized(&local_260,pCVar49);
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_c0.m_data[0];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_260.m_data[0];
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_c0.m_data[1] * local_260.m_data[1];
    auVar21 = vfmadd231sd_fma(auVar79,auVar57,auVar2);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_c0.m_data[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_260.m_data[2];
    auVar21 = vfmadd132sd_fma(auVar58,auVar21,auVar3);
    *(long *)((long)pCVar46->cM[0].m_data + lVar52) = auVar21._0_8_;
    ChVector<double>::GetNormalized(&local_260,pCVar49);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_a8._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_260.m_data[0];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (double)local_a8._8_8_ * local_260.m_data[1];
    auVar21 = vfmadd231sd_fma(auVar80,auVar59,auVar4);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_98;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_260.m_data[2];
    auVar21 = vfmadd132sd_fma(auVar60,auVar21,auVar5);
    *(long *)((long)pCVar46->cM[0].m_data + lVar52 + 8) = auVar21._0_8_;
    ChVector<double>::GetNormalized(&local_260,pCVar49);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_90._0_8_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_260.m_data[0];
    auVar81._8_8_ = 0;
    auVar81._0_8_ = (double)local_90._8_8_ * local_260.m_data[1];
    auVar21 = vfmadd231sd_fma(auVar81,auVar61,auVar6);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_80;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_260.m_data[2];
    auVar21 = vfmadd132sd_fma(auVar62,auVar21,auVar7);
    *(long *)((long)pCVar46->cM[0].m_data + lVar52 + 0x10) = auVar21._0_8_;
  }
  local_e0 = local_210->cI;
  local_1e0._0_8_ = 0x8000000000000000;
  local_1e0._8_8_ = 0x8000000000000000;
  uVar53 = 0xffffffff;
  local_1f0._0_8_ = 1;
  lVar51 = 0;
  for (lVar52 = 0; lVar52 != 0x30; lVar52 = lVar52 + 0x10) {
    psVar19 = (local_210->m_nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&psVar19[3].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar52) == 0) {
      *(undefined8 *)((long)local_e0->m_data + lVar51 + 0x10) = 0;
      *(undefined1 (*) [16])((long)local_e0->m_data + lVar51) = ZEXT816(0) << 0x40;
    }
    else {
      lVar54 = local_1f0._0_8_;
      if (lVar52 == 0x20) {
        lVar54 = 0;
      }
      (**(code **)(*(long *)&(psVar19[lVar54].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
      local_230._0_4_ = (undefined4)uVar53;
      local_230._4_4_ = (undefined4)(uVar53 >> 0x20);
      uVar53 = uVar53 & 0xffffffff;
      if (lVar52 == 0) {
        uVar53 = 2;
      }
      (**(code **)(*(long *)&((pCVar47->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
      local_1d0._0_8_ = local_260.m_data[0] - local_1c0.m_data[0];
      dVar55 = local_260.m_data[1] - local_1c0.m_data[1];
      local_218 = (ChVector<double> *)(local_260.m_data[2] - local_1c0.m_data[2]);
      (**(code **)(**(long **)((long)&(pCVar47->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar52) + 0x60))(&local_260);
      (**(code **)(*(long *)&((pCVar47->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar54].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_1c0);
      local_238 = (ChVector<double> *)(local_260.m_data[0] - local_1c0.m_data[0]);
      local_200 = (ChVector<double> *)(local_260.m_data[1] - local_1c0.m_data[1]);
      local_1a0 = local_260.m_data[2] - local_1c0.m_data[2];
      (**(code **)(*(long *)&((pCVar47->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
      (**(code **)(**(long **)((long)&(pCVar47->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar52) + 0x60))(&local_1c0);
      pCVar49 = (ChVector<double> *)((long)local_c0.m_data + lVar51);
      local_c8 = local_260.m_data[0] - local_1c0.m_data[0];
      local_d8 = local_260.m_data[1] - local_1c0.m_data[1];
      local_d0 = local_260.m_data[2] - local_1c0.m_data[2];
      ChVector<double>::GetNormalized(&local_260,pCVar49);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_1d0._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_260.m_data[0];
      auVar63._8_8_ = 0;
      auVar63._0_8_ = dVar55 * local_260.m_data[1];
      auVar21 = vfmadd231sd_fma(auVar63,auVar82,auVar8);
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_218;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_260.m_data[2];
      auVar21 = vfmadd231sd_fma(auVar21,auVar83,auVar9);
      auVar64._0_8_ = auVar21._0_8_ ^ local_1e0._0_8_;
      auVar64._8_8_ = auVar21._8_8_ ^ local_1e0._8_8_;
      uVar1 = vmovlpd_avx(auVar64);
      *(undefined8 *)((long)pCVar47->cI[0].m_data + lVar51) = uVar1;
      ChVector<double>::GetNormalized(&local_260,pCVar49);
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_238;
      uVar53 = CONCAT44(local_230._4_4_,(undefined4)local_230);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_260.m_data[0];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = (double)local_200 * local_260.m_data[1];
      auVar21 = vfmadd231sd_fma(auVar65,auVar84,auVar10);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_1a0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_260.m_data[2];
      auVar21 = vfmadd231sd_fma(auVar21,auVar85,auVar11);
      auVar66._0_8_ = auVar21._0_8_ ^ local_1e0._0_8_;
      auVar66._8_8_ = auVar21._8_8_ ^ local_1e0._8_8_;
      uVar1 = vmovlpd_avx(auVar66);
      *(undefined8 *)((long)pCVar47->cI[0].m_data + lVar51 + 8) = uVar1;
      ChVector<double>::GetNormalized(&local_260,pCVar49);
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_c8;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_260.m_data[0];
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_d8 * local_260.m_data[1];
      auVar21 = vfmadd231sd_fma(auVar67,auVar86,auVar12);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = local_d0;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_260.m_data[2];
      auVar21 = vfmadd231sd_fma(auVar21,auVar87,auVar13);
      auVar68._0_8_ = auVar21._0_8_ ^ local_1e0._0_8_;
      auVar68._8_8_ = auVar21._8_8_ ^ local_1e0._8_8_;
      uVar1 = vmovlpd_avx(auVar68);
      *(undefined8 *)((long)pCVar47->cI[0].m_data + lVar51 + 0x10) = uVar1;
    }
    local_1f0._0_8_ = local_1f0._0_8_ + 1;
    uVar53 = uVar53 + 1;
    lVar51 = lVar51 + 0x18;
  }
  dVar55 = ChVector<double>::Length(&local_c0);
  pCVar46 = local_210;
  (local_210->l0).m_data[0] = dVar55;
  dVar55 = ChVector<double>::Length((ChVector<double> *)local_a8);
  (pCVar46->l0).m_data[1] = dVar55;
  dVar55 = ChVector<double>::Length((ChVector<double> *)local_90);
  (pCVar46->l0).m_data[2] = dVar55;
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  (**(code **)(*(long *)&((((pCVar46->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  auVar25._8_8_ = local_260.m_data[1];
  auVar25._0_8_ = local_260.m_data[0];
  auVar38._8_8_ = local_190.m_data[1];
  auVar38._0_8_ = local_190.m_data[0];
  local_1e0 = vsubpd_avx(auVar25,auVar38);
  local_1c0.m_data[0] = local_1e0._0_8_;
  local_1c0.m_data[1] = local_1e0._8_8_;
  local_1c0.m_data[2] = local_260.m_data[2] - local_190.m_data[2];
  uStack_228 = 0;
  local_230 = local_1c0.m_data[2];
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  (**(code **)(*(long *)&((((pCVar46->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_190);
  auVar26._8_8_ = local_260.m_data[1];
  auVar26._0_8_ = local_260.m_data[0];
  auVar27._8_8_ = uStack_228;
  auVar27._0_8_ = local_230;
  auVar39._8_8_ = local_190.m_data[1];
  auVar39._0_8_ = local_190.m_data[0];
  auVar22 = vsubpd_avx(auVar26,auVar39);
  local_1f0 = vshufpd_avx(local_1e0,local_1e0,1);
  auVar21 = vshufpd_avx(auVar22,auVar22,1);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_260.m_data[2] - local_190.m_data[2];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = auVar21._0_8_ * local_230;
  auVar23 = vfmsub231sd_fma(auVar99,local_1f0,auVar69);
  auVar21 = vunpcklpd_avx(auVar69,auVar22);
  auVar70._0_8_ = auVar21._0_8_ * local_1e0._0_8_;
  auVar70._8_8_ = auVar21._8_8_ * local_1e0._8_8_;
  local_1d0 = vunpcklpd_avx(auVar27,local_1e0);
  auVar21 = vfmsub231pd_fma(auVar70,local_1d0,auVar22);
  local_260.m_data[0] = auVar23._0_8_;
  local_260.m_data[1] = auVar21._0_8_;
  local_260.m_data[2] = auVar21._8_8_;
  ChVector<double>::GetNormalized(&local_190,&local_260);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_190.m_data[2];
  auVar40._8_8_ = local_190.m_data[1];
  auVar40._0_8_ = local_190.m_data[0];
  auVar28._8_8_ = uStack_228;
  auVar28._0_8_ = local_230;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_190.m_data[1];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = local_190.m_data[2] * (double)local_1f0._0_8_;
  auVar22 = vfmsub231sd_fma(auVar88,auVar28,auVar14);
  auVar106._0_8_ = local_190.m_data[0] * (double)local_1d0._0_8_;
  auVar106._8_8_ = local_190.m_data[1] * (double)local_1d0._8_8_;
  auVar21 = vunpcklpd_avx(auVar71,auVar40);
  unique0x001c5280 = vfmsub132pd_fma(auVar21,auVar106,local_1e0);
  local_110._0_8_ = auVar22._0_8_;
  ChVector<double>::GetNormalized(&local_260,(ChVector<double> *)local_110);
  local_1e0._0_8_ = local_260.m_data[0];
  local_1f0._0_8_ = local_260.m_data[1];
  local_230._0_4_ = SUB84(local_260.m_data[2],0);
  local_230._4_4_ = (undefined4)((ulong)local_260.m_data[2] >> 0x20);
  ChVector<double>::Normalize(&local_1c0);
  (**(code **)(*(long *)&((((pCVar46->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  dVar45 = local_260.m_data[0];
  local_218 = (ChVector<double> *)local_260.m_data[1];
  local_1d0._0_8_ = local_260.m_data[2];
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(local_110);
  dVar55 = (double)local_110._0_8_ * 0.0;
  local_238 = (ChVector<double> *)((double)local_110._8_8_ * 0.0 + (double)local_218);
  local_1d0._0_8_ = dStack_100 * 0.0 + (double)local_1d0._0_8_;
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  local_218 = (ChVector<double> *)((dVar55 + dVar45) - local_140.m_data[0]);
  dVar55 = (double)local_238 - local_140.m_data[1];
  local_1d0._0_8_ = (double)local_1d0._0_8_ - local_140.m_data[2];
  (**(code **)(*(long *)&((((pCVar46->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_260);
  local_238 = (ChVector<double> *)(local_260.m_data[0] * 0.0);
  local_1a0 = local_260.m_data[1] * 0.0;
  local_200 = (ChVector<double> *)(local_260.m_data[2] * 0.0);
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(local_110);
  local_238 = (ChVector<double> *)((double)local_238 + (double)local_110._0_8_);
  local_1a0 = local_1a0 + (double)local_110._8_8_;
  local_200 = (ChVector<double> *)((double)local_200 + dStack_100);
  (**(code **)(*(long *)&((pCVar46->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_140);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_1c0.m_data[0];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = local_218;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_1c0.m_data[2];
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_1d0._0_8_;
  local_110._0_8_ = 1e-10;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar55 * local_1c0.m_data[1];
  auVar21 = vfmadd231sd_fma(auVar112,auVar116,auVar107);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = (double)local_238 - local_140.m_data[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = (local_1a0 - local_140.m_data[1]) * local_1c0.m_data[1];
  auVar22 = vfmadd231sd_fma(auVar110,auVar72,auVar107);
  auVar21 = vfmadd231sd_fma(auVar21,auVar117,auVar115);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (double)local_200 - local_140.m_data[2];
  auVar22 = vfmadd231sd_fma(auVar22,auVar100,auVar115);
  local_260.m_data[0] = auVar21._0_8_;
  auVar113._4_4_ = local_230._4_4_;
  auVar113._0_4_ = (undefined4)local_230;
  auVar113._8_8_ = 0;
  local_260.m_data[1] = auVar22._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_1e0._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = dVar55 * (double)local_1f0._0_8_;
  auVar21 = vfmadd231sd_fma(auVar108,auVar118,auVar116);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (double)local_1f0._0_8_ * (local_1a0 - local_140.m_data[1]);
  auVar22 = vfmadd231sd_fma(auVar89,auVar72,auVar118);
  auVar21 = vfmadd231sd_fma(auVar21,auVar113,auVar117);
  auVar22 = vfmadd231sd_fma(auVar22,auVar100,auVar113);
  local_260.m_data[2] = auVar21._0_8_;
  local_248 = auVar22._0_8_;
  Eigen::MatrixBase<Eigen::Matrix<double,2,2,1,2,2>>::
  computeInverseWithCheck<Eigen::Matrix<double,2,2,1,2,2>>
            ((MatrixBase<Eigen::Matrix<double,2,2,1,2,2>> *)&local_260,&pCVar46->Jux,&local_1f1,
             (RealScalar *)local_110);
  if (local_1f1 == false) {
    this_01 = GetLog();
    ChStreamOutAscii::operator<<
              (&this_01->super_ChStreamOutAscii,
               "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n");
  }
  pCVar46 = local_210;
  dVar55 = DAT_011dd3e0;
  if (local_210 != (ChElementShellBST *)&std::__ioinit) {
    (local_210->e0).m_data[0] = VNULL;
    (local_210->e0).m_data[1] = dVar55;
    (local_210->e0).m_data[2] = DAT_011dd3e8;
  }
  dVar55 = DAT_011dd3e0;
  local_200 = &local_210->k0;
  if (local_200 != (ChVector<double> *)&VNULL) {
    (local_210->k0).m_data[0] = VNULL;
    (local_210->k0).m_data[1] = dVar55;
    (local_210->k0).m_data[2] = DAT_011dd3e8;
  }
  local_238 = &local_210->l0;
  local_218 = &local_210->phi0;
  pCVar49 = &local_210->rI;
  local_1a0 = 1.0;
  uStack_198 = 0x3ff0000000000000;
  lVar52 = 0;
  while (lVar52 != 3) {
    peVar20 = (local_210->m_nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar52 + 3].
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    index = (uint)lVar52;
    if (peVar20 == (element_type *)0x0) {
      pdVar48 = ChVector<double>::operator[](local_218,index);
      *pdVar48 = 0.0;
      pdVar48 = ChVector<double>::operator[](pCVar49,index);
      lVar52 = lVar52 + 1;
      *pdVar48 = 0.5;
    }
    else {
      (**(code **)(*(long *)&peVar20->super_ChNodeFEAbase + 0x60))(&local_160);
      local_1e0._0_8_ = lVar52 + 1U;
      uVar53 = 0;
      if (lVar52 != 2) {
        uVar53 = lVar52 + 1U & 0xffffffff;
      }
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_128);
      local_230 = local_160.m_data[0] - local_128;
      uStack_228 = 0;
      uVar50 = (ulong)(index - 1);
      if (lVar52 == 0) {
        uVar50 = 2;
      }
      auVar44._8_8_ = local_160.m_data[2];
      auVar44._0_8_ = local_160.m_data[1];
      local_1f0 = vsubpd_avx(auVar44,local_120);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar50].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uStack_168;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = local_e8;
      auVar29._8_8_ = uStack_228;
      auVar29._0_8_ = local_230;
      auVar21 = vmovhpd_avx(auVar90,local_178);
      auVar22 = vmovhpd_avx(auVar101,local_f8);
      auVar22 = vsubpd_avx(auVar21,auVar22);
      auVar21 = vshufpd_avx(local_1f0,auVar29,1);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_170 - local_f0;
      auVar23 = vunpcklpd_avx(auVar73,auVar22);
      auVar102._0_8_ = auVar23._0_8_ * auVar21._0_8_;
      auVar102._8_8_ = auVar23._8_8_ * auVar21._8_8_;
      local_140.m_data._0_16_ = vfmsub231pd_fma(auVar102,local_1f0,auVar22);
      auVar21 = vshufpd_avx(auVar22,auVar22,1);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = auVar21._0_8_ * local_1f0._0_8_;
      auVar21 = vfmsub231sd_fma(auVar91,auVar29,auVar73);
      local_140.m_data[2] = auVar21._0_8_;
      ChVector<double>::GetNormalized((ChVector<double> *)local_110,&local_140);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_128);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar50].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_190.m_data[0];
      auVar114._8_8_ = local_190.m_data[2];
      auVar114._0_8_ = local_190.m_data[2];
      auVar41._8_8_ = local_190.m_data[2];
      auVar41._0_8_ = local_190.m_data[1];
      auVar42._8_8_ = uStack_168;
      auVar42._0_8_ = local_170;
      auVar22 = vsubpd_avx(local_120,auVar42);
      auVar23 = vunpcklpd_avx(auVar114,auVar92);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_128 - local_178;
      auVar21 = vshufpd_avx(auVar22,auVar74,1);
      auVar111._0_8_ = local_190.m_data[1] * auVar21._0_8_;
      auVar111._8_8_ = local_190.m_data[2] * auVar21._8_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = local_190.m_data[0] * auVar22._0_8_;
      auVar24 = vfmsub231sd_fma(auVar93,auVar74,auVar41);
      auVar21 = vfmsub213pd_fma(auVar23,auVar22,auVar111);
      local_160.m_data[0] = auVar21._0_8_;
      local_160.m_data[1] = auVar21._8_8_;
      local_160.m_data[2] = auVar24._0_8_;
      ChVector<double>::GetNormalized(&local_140,&local_160);
      auVar103._8_8_ = 0;
      auVar103._0_8_ = local_110._0_8_;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = dStack_100;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_190.m_data[0];
      auVar94._8_8_ = 0;
      auVar94._0_8_ = (double)local_110._8_8_ * local_190.m_data[1];
      auVar21 = vfmadd231sd_fma(auVar94,auVar103,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_140.m_data[0];
      auVar75._8_8_ = 0;
      auVar75._0_8_ = (double)local_110._8_8_ * local_140.m_data[1];
      auVar22 = vfmadd231sd_fma(auVar75,auVar103,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_190.m_data[2];
      auVar21 = vfmadd231sd_fma(auVar21,auVar109,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_140.m_data[2];
      auVar22 = vfmadd231sd_fma(auVar22,auVar109,auVar18);
      dVar55 = atan2(auVar22._0_8_,auVar21._0_8_);
      local_230._0_4_ = SUB84(dVar55,0);
      local_230._4_4_ = (undefined4)((ulong)dVar55 >> 0x20);
      pdVar48 = ChVector<double>::operator[](local_218,index);
      *pdVar48 = (double)CONCAT44(local_230._4_4_,(undefined4)local_230);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar52 + 3].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_128);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_178);
      local_230 = local_128 - local_178;
      uStack_228 = 0;
      auVar43._8_8_ = uStack_168;
      auVar43._0_8_ = local_170;
      local_1f0 = vsubpd_avx(local_120,auVar43);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar50].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_f8);
      (**(code **)(*(long *)&((pCVar46->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar53].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_e8;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_60;
      auVar30._8_8_ = uStack_228;
      auVar30._0_8_ = local_230;
      auVar21 = vmovhpd_avx(auVar95,local_f8);
      auVar22 = vmovhpd_avx(auVar104,local_70);
      auVar22 = vsubpd_avx(auVar21,auVar22);
      auVar21 = vshufpd_avx(local_1f0,auVar30,1);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_f0 - local_68;
      auVar23 = vunpcklpd_avx(auVar76,auVar22);
      auVar105._0_8_ = auVar23._0_8_ * auVar21._0_8_;
      auVar105._8_8_ = auVar23._8_8_ * auVar21._8_8_;
      auVar23 = vfmsub231pd_fma(auVar105,local_1f0,auVar22);
      auVar21 = vshufpd_avx(auVar22,auVar22,1);
      auVar96._8_8_ = 0;
      auVar96._0_8_ = auVar21._0_8_ * local_1f0._0_8_;
      auVar21 = vfmsub231sd_fma(auVar96,auVar30,auVar76);
      local_160.m_data[0] = auVar23._0_8_;
      local_160.m_data[1] = auVar23._8_8_;
      local_160.m_data[2] = auVar21._0_8_;
      dVar55 = ChVector<double>::Length(&local_160);
      this_00 = local_238;
      local_230._0_4_ = SUB84(dVar55,0);
      local_230._4_4_ = (undefined4)((ulong)dVar55 >> 0x20);
      uStack_228 = extraout_XMM0_Qb;
      pdVar48 = ChVector<double>::operator[](local_238,index);
      local_1f0._8_8_ = 0;
      local_1f0._0_8_ = *pdVar48;
      local_1d0._8_8_ = 0;
      local_1d0._0_8_ = pCVar46->area + pCVar46->area;
      pdVar48 = ChVector<double>::operator[](this_00,index);
      auVar31._4_4_ = local_230._4_4_;
      auVar31._0_4_ = (undefined4)local_230;
      auVar31._8_8_ = uStack_228;
      auVar22 = vunpcklpd_avx(auVar31,local_1d0);
      auVar21 = vmovhpd_avx(local_1f0,*pdVar48);
      auVar21 = vdivpd_avx(auVar22,auVar21);
      auVar37._8_8_ = uStack_198;
      auVar37._0_8_ = local_1a0;
      auVar21 = vdivpd_avx(auVar37,auVar21);
      local_230 = auVar21._0_8_ / (auVar21._0_8_ + auVar21._8_8_);
      pdVar48 = ChVector<double>::operator[](pCVar49,index);
      *pdVar48 = local_230;
      lVar52 = local_1e0._0_8_;
    }
  }
  ChVector<double>::operator*=(local_200,local_210->area * 4.0);
  return;
}

Assistant:

void ChElementShellBST::SetupInitial(ChSystem* system) {

    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

	// Compute element area
	this->area = 0.5 * Vlength( Vcross(m_nodes[1]->GetX0() - m_nodes[0]->GetX0(), m_nodes[2]->GetX0() - m_nodes[0]->GetX0()) );
	
	// Compute cM and cI coefficients
	ChVector<> Li[3];
	Li[0] = m_nodes[2]->GetX0() - m_nodes[1]->GetX0();
	Li[1] = m_nodes[0]->GetX0() - m_nodes[2]->GetX0();
	Li[2] = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();

	for (int i = 0; i < 3; ++i) {
		this->cM[i][0] = Vdot(Li[0], Li[i].GetNormalized());
		this->cM[i][1] = Vdot(Li[1], Li[i].GetNormalized());
		this->cM[i][2] = Vdot(Li[2], Li[i].GetNormalized());
	}
	ChVector<> LIi[3];
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			LIi[0] = m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0();
			LIi[1] = m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0();
			LIi[2] = m_nodes[(i + 2) % 3]->GetX0() - m_nodes[i + 3]->GetX0();
			this->cI[i][0] = -Vdot(LIi[0], Li[i].GetNormalized());
			this->cI[i][1] = -Vdot(LIi[1], Li[i].GetNormalized());
			this->cI[i][2] = -Vdot(LIi[2], Li[i].GetNormalized());
		}
		else {
			cI[i][0] = cI[i][1] = cI[i][2] = 0;
		}
	}

	// Compute initial side lengths
	this->l0[0] = Li[0].Length();
	this->l0[1] = Li[1].Length();
	this->l0[2] = Li[2].Length();

	// Compute orthogonal system at triangle in carthesian basis
	ChVector<> t0_1 = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();
	ChVector<> t0_2 = m_nodes[2]->GetX0() - m_nodes[0]->GetX0();
	// Compute normal - and orthogonalize others
	ChVector<> t0_3 = Vcross(t0_1, t0_2).GetNormalized(); // The normal
	t0_2 = (Vcross(t0_3, t0_1)).GetNormalized();
	t0_1.Normalize();

	// Compute jacobian
	ShapeVector  N;
	this->ShapeFunctions(N, 1./3., 1./3.);
	ShapeVector  Nu;
	this->ShapeFunctionsDerivativeU(Nu, 1./3., 1./3.);
	ShapeVector  Nv;
	this->ShapeFunctionsDerivativeV(Nv, 1./3., 1./3.);

	//GetLog() << "Nu: " << Nu(0,0) << "  " << Nu(0,1) << "  " << Nu(0,2) << "\n" << "Nv: " << Nv(0,0) << "  " << Nv(0,1) << "  " << Nv(0,2) << "\n";

	ChVector<> P0_u = Nu(0,0) * m_nodes[0]->GetX0() + Nu(0,1) * m_nodes[1]->GetX0() + Nu(0,2) * m_nodes[2]->GetX0();
	ChVector<> P0_v = Nv(0,0) * m_nodes[0]->GetX0() + Nv(0,1) * m_nodes[1]->GetX0() + Nv(0,2) * m_nodes[2]->GetX0();
	//GetLog() << "t0_1= \n" << t0_1 <<  "\n";
	//GetLog() << "t0_2= \n" << t0_2 <<  "\n";
	//GetLog() << "P0_u= \n" << P0_u <<  "\n";
	//GetLog() << "P0_v= \n" << P0_v <<  "\n";

	ChMatrixNM<double, 2, 2> Jxu;
	Jxu(0, 0) = Vdot(P0_u, t0_1);
	Jxu(0, 1) = Vdot(P0_v, t0_1);
	Jxu(1, 0) = Vdot(P0_u, t0_2);
	Jxu(1, 1) = Vdot(P0_v, t0_2);
	//GetLog() << "Jxu= \n" << "  " << Jxu(0, 0) << "  " << Jxu(0, 1) << "\n" << "  " << Jxu(1, 0) << "  " << Jxu(1, 1) << "\n";

	bool invertible;
	Jxu.computeInverseWithCheck(this->Jux, invertible, 1e-10);
	if (!invertible)
		GetLog() << "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n";
	//GetLog() << "Jux= \n" << "  " << Jux(0, 0) << "  " << Jux(0, 1) << "\n" << "  " << Jux(1, 0) << "  " << Jux(1, 1) << "\n";

	ShapeVector  Nx;
	this->ShapeFunctionsDerivativeX(Nx, this->Jux, 1./3., 1./3.);
	ShapeVector  Ny;
	this->ShapeFunctionsDerivativeY(Ny, this->Jux, 1./3., 1./3.);

	//GetLog() << "Nx: " << Nx(0) << "  " << Nx(1) << "  " << Nx(2) << "\n" << "Ny: " << Ny(0) << "  " << Ny(1) << "  " << Ny(2) << "\n";
	

	// Compute initial strain e0
	this->e0 = VNULL;

	// Compute initial edge bendings phi[i]
	// Use the BST method in "kinked and branched shells"
	this->k0 = VNULL;
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			// normal of ith neighbouring triangle, opposed to ith triangle vertex:
			ChVector<> t0i_3 = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).GetNormalized();
			// boundary normal to shared edge:
			ChVector<> n_i = Vcross(m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0(), t0_3).GetNormalized();
			// edge angle
			double mcos_fi = Vdot(t0_3, t0i_3);
			double msin_fi = Vdot(n_i, t0i_3);
			this->phi0[i] = atan2(msin_fi, mcos_fi);
			// curvature
			// NOT NEEDED? k here as 'change' of curvature in bent meshes, only phi0 matters.
			//this->k0 += VNULL;
			// precompute rI coefficients = RIi/(RMi/RIi) = (1/hIi)/((1/hMi)(1/hIi)) assuming heights h remains not changed
			double hIi = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).Length() / this->l0[i];
			double hMi = 2.0 * this->area / this->l0[i];
			this->rI[i] = (1.0 / hIi) / ((1.0 / hMi) + (1.0 / hIi));
		}
		else {
			this->phi0[i] = 0;
			this->rI[i] = 0.5;
			//this->k0 += VNULL;
		}
	}
	this->k0 *= this->area * 4.0;

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

}